

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

RepeatedField<bool> * __thiscall
google::protobuf::Arena::DoCreateMessage<google::protobuf::RepeatedField<bool>>(Arena *this)

{
  RepeatedField<bool> *pRVar1;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar2;
  
  pVar2 = AllocateAlignedWithCleanup(this,0x10,(type_info *)&RepeatedField<bool>::typeinfo);
  pRVar1 = (RepeatedField<bool> *)pVar2.first;
  (pVar2.second)->elem = pRVar1;
  (pVar2.second)->cleanup = internal::arena_destruct_object<google::protobuf::RepeatedField<bool>>;
  pRVar1->current_size_ = 0;
  pRVar1->total_size_ = 0;
  pRVar1->arena_or_elements_ = this;
  return pRVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }